

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O0

void __thiscall XPMP2::RmtDataAcAnimTy::add(RmtDataAcAnimTy *this,DR_VALS idx,float f)

{
  uint8_t uVar1;
  XPMP2Error *this_00;
  undefined1 in_SIL;
  long in_RDI;
  size_type in_stack_ffffffffffffffc8;
  array<XPMP2::RemoteDataRefPackTy,_42UL> *in_stack_ffffffffffffffd0;
  RemoteDataRefPackTy *in_stack_ffffffffffffffe0;
  
  if (0x29 < *(byte *)(in_RDI + 0xd)) {
    this_00 = (XPMP2Error *)__cxa_allocate_exception(0x78);
    XPMP2Error::XPMP2Error
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Remote.cpp"
               ,0x1f1,"add","ASSERT FAILED: %s","data.numVals < V_COUNT");
    __cxa_throw(this_00,&XPMP2Error::typeinfo,XPMP2Error::~XPMP2Error);
  }
  *(undefined1 *)(in_RDI + 0xf + (ulong)*(byte *)(in_RDI + 0xd) * 2) = in_SIL;
  std::array<XPMP2::RemoteDataRefPackTy,_42UL>::operator[]
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  uVar1 = RemoteDataRefPackTy::pack(in_stack_ffffffffffffffe0,(float)((ulong)in_RDI >> 0x20));
  *(uint8_t *)(in_RDI + 0x10 + (ulong)*(byte *)(in_RDI + 0xd) * 2) = uVar1;
  *(char *)(in_RDI + 0xd) = *(char *)(in_RDI + 0xd) + '\x01';
  return;
}

Assistant:

void RmtDataAcAnimTy::add (DR_VALS idx, float f)
{
    LOG_ASSERT(data.numVals < V_COUNT);
    data.v[data.numVals].idx = idx;
    data.v[data.numVals].v   = REMOTE_DR_DEF[idx].pack(f);
    ++data.numVals;
}